

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2textformat::SplitString
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          s2textformat *this,string_view str,char separator)

{
  pointer psVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type sVar2;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  string_view *e;
  pointer psVar3;
  string_view sVar4;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  string_view local_28;
  
  local_28.length_ = (size_type)str.ptr_;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::_Function_handler<bool_(absl::string_view),_absl::SkipWhitespace>::_M_invoke;
  local_38 = std::_Function_handler<bool_(absl::string_view),_absl::SkipWhitespace>::_M_manager;
  local_28.ptr_ = (char *)this;
  absl::StrSplit<absl::string_view>
            (__return_storage_ptr__,&local_28,(char)str.length_,
             (function<bool_(absl::string_view)> *)&local_48);
  sVar2 = extraout_RDX;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    sVar2 = extraout_RDX_00;
  }
  psVar1 = (__return_storage_ptr__->
           super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar3 = (__return_storage_ptr__->
                super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
                super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    sVar4.length_ = sVar2;
    sVar4.ptr_ = (char *)psVar3->length_;
    sVar4 = absl::StripAsciiWhitespace((absl *)psVar3->ptr_,sVar4);
    sVar2 = sVar4.length_;
    *psVar3 = sVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<string_view> SplitString(string_view str, char separator) {
  vector<string_view> result =
      absl::StrSplit(str, separator, absl::SkipWhitespace());
  for (auto& e : result) {
    e = absl::StripAsciiWhitespace(e);
  }
  return result;
}